

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setSubData
          (Texture *this,ConstPixelBufferAccess *src,int xOff,int yOff,int width,int height)

{
  uint uVar1;
  TransferFormat TVar2;
  byte bVar3;
  GLenum *pGVar4;
  int iVar5;
  uint param;
  GLenum target;
  GLsizei GVar6;
  GLsizei GVar7;
  int face;
  uint uVar8;
  
  TVar2 = glu::getTransferFormat(src->m_format);
  uVar1 = tcu::TextureFormat::getPixelSize(&src->m_format);
  uVar8 = 8;
  if ((int)uVar1 < 8) {
    uVar8 = uVar1;
  }
  param = 1;
  if ((uVar1 & uVar1 - 1) == 0) {
    param = uVar8;
  }
  glwPixelStorei(0xcf5,param);
  if (this->m_type == TEXTURETYPE_CUBE) {
    glwBindTexture(0x8513,this->m_textureGL);
    if (0 < this->m_numMipLevels) {
      iVar5 = 0;
      do {
        bVar3 = (byte)iVar5;
        GVar6 = width >> (bVar3 & 0x1f);
        if (GVar6 < 2) {
          GVar6 = 1;
        }
        GVar7 = height >> (bVar3 & 0x1f);
        if (GVar7 < 2) {
          GVar7 = 1;
        }
        pGVar4 = &DAT_00b7cbec;
        uVar8 = 0;
        do {
          target = 0;
          if (uVar8 < 6) {
            target = *pGVar4;
          }
          glwTexSubImage2D(target,iVar5,xOff >> (bVar3 & 0x1f),yOff >> (bVar3 & 0x1f),GVar6,GVar7,
                           TVar2.format,TVar2.dataType,src->m_data);
          uVar8 = uVar8 + 1;
          pGVar4 = pGVar4 + 1;
        } while (uVar8 != 6);
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->m_numMipLevels);
    }
  }
  else if ((this->m_type == TEXTURETYPE_2D) &&
          (glwBindTexture(0xde1,this->m_textureGL), 0 < this->m_numMipLevels)) {
    iVar5 = 0;
    do {
      bVar3 = (byte)iVar5;
      GVar6 = width >> (bVar3 & 0x1f);
      if (GVar6 < 2) {
        GVar6 = 1;
      }
      GVar7 = height >> (bVar3 & 0x1f);
      if (GVar7 < 2) {
        GVar7 = 1;
      }
      glwTexSubImage2D(0xde1,iVar5,xOff >> (bVar3 & 0x1f),yOff >> (bVar3 & 0x1f),GVar6,GVar7,
                       TVar2.format,TVar2.dataType,src->m_data);
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->m_numMipLevels);
  }
  return;
}

Assistant:

void Texture::setSubData (const ConstPixelBufferAccess& src, const int xOff, const int yOff, const int width, const int height) const
{
	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(m_internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
			glTexSubImage2D(GL_TEXTURE_2D, level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexSubImage2D(cubeFaceToGLFace((CubeFace)face), level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}